

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O1

int R_FindCustomTranslation(FName *name)

{
  Node *pNVar1;
  int iVar2;
  uint uVar3;
  Node *pNVar4;
  
  uVar3 = name->Index;
  if ((long)(int)uVar3 < 0x29b) {
    if (uVar3 - 0x293 < 8) {
      uVar3 = uVar3 - 0x293 | 0x90000;
    }
    else if (uVar3 != 0) {
      if (uVar3 == 0x33) {
        return 0x30007;
      }
      goto LAB_0033205b;
    }
  }
  else {
    if (7 < uVar3 - 0x29b) {
LAB_0033205b:
      uVar3 = FName::NameManager::FindName
                        (&FName::NameData,FName::NameData.NameArray[(int)uVar3].Text,true);
      pNVar1 = customTranslationMap.Nodes + (customTranslationMap.Size - 1 & uVar3);
      while ((pNVar4 = pNVar1, pNVar4 != (Node *)0x0 && (pNVar4->Next != (Node *)0x1))) {
        pNVar1 = pNVar4->Next;
        if ((pNVar4->Pair).Key.Index == uVar3) {
LAB_003320a8:
          if (pNVar4 == (Node *)0x0) {
            iVar2 = -1;
          }
          else {
            iVar2 = (pNVar4->Pair).Value;
          }
          return iVar2;
        }
      }
      pNVar4 = (Node *)0x0;
      goto LAB_003320a8;
    }
    uVar3 = uVar3 - 0x29b | 0x10000;
  }
  return uVar3;
}

Assistant:

operator int() const { return Index; }